

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

CPubKey * __thiscall
wallet::LegacyScriptPubKeyMan::DeriveNewSeed
          (CPubKey *__return_storage_ptr__,LegacyScriptPubKeyMan *this,CKey *key)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int64_t nCreateTime_;
  mapped_type *this_00;
  runtime_error *this_01;
  long in_FS_OFFSET;
  allocator<char> local_e9;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  CKeyMetadata metadata;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  nCreateTime_ = GetTime();
  CKeyMetadata::CKeyMetadata(&metadata,nCreateTime_);
  CKey::GetPubKey(__return_storage_ptr__,key);
  bVar2 = CKey::VerifyPubKey(key,__return_storage_ptr__);
  if (!bVar2) {
    __assert_fail("key.VerifyPubKey(seed)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x4c8,"CPubKey wallet::LegacyScriptPubKeyMan::DeriveNewSeed(const CKey &)");
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&metadata.hdKeypath,"s");
  metadata.has_key_origin = false;
  CPubKey::GetID((CKeyID *)&local_b8,__return_storage_ptr__);
  metadata.hd_seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x10] =
       local_b8.field_2._M_local_buf[0];
  metadata.hd_seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x11] =
       local_b8.field_2._M_local_buf[1];
  metadata.hd_seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x12] =
       local_b8.field_2._M_local_buf[2];
  metadata.hd_seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x13] =
       local_b8.field_2._M_local_buf[3];
  metadata.hd_seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems._0_8_ =
       local_b8._M_dataplus._M_p;
  metadata.hd_seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[8] =
       (undefined1)local_b8._M_string_length;
  metadata.hd_seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[9] =
       local_b8._M_string_length._1_1_;
  metadata.hd_seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[10] =
       local_b8._M_string_length._2_1_;
  metadata.hd_seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xb] =
       local_b8._M_string_length._3_1_;
  metadata.hd_seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xc] =
       local_b8._M_string_length._4_1_;
  metadata.hd_seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xd] =
       local_b8._M_string_length._5_1_;
  metadata.hd_seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xe] =
       local_b8._M_string_length._6_1_;
  metadata.hd_seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xf] =
       local_b8._M_string_length._7_1_;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock39,
             &(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore,"cs_KeyStore",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0x4d0,false);
  CPubKey::GetID((CKeyID *)&local_b8,__return_storage_ptr__);
  this_00 = std::
            map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
            ::operator[](&(this->super_LegacyDataSPKM).mapKeyMetadata,(key_type *)&local_b8);
  CKeyMetadata::operator=(this_00,&metadata);
  iVar3 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x23])
                    (this,key,__return_storage_ptr__);
  if ((char)iVar3 == '\0') {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"DeriveNewSeed",&local_e9);
    std::operator+(&local_b8,&local_d8,": AddKeyPubKey failed");
    std::runtime_error::runtime_error(this_01,(string *)&local_b8);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock39.super_unique_lock);
    CKeyMetadata::~CKeyMetadata(&metadata);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

CPubKey LegacyScriptPubKeyMan::DeriveNewSeed(const CKey& key)
{
    int64_t nCreationTime = GetTime();
    CKeyMetadata metadata(nCreationTime);

    // calculate the seed
    CPubKey seed = key.GetPubKey();
    assert(key.VerifyPubKey(seed));

    // set the hd keypath to "s" -> Seed, refers the seed to itself
    metadata.hdKeypath     = "s";
    metadata.has_key_origin = false;
    metadata.hd_seed_id = seed.GetID();

    {
        LOCK(cs_KeyStore);

        // mem store the metadata
        mapKeyMetadata[seed.GetID()] = metadata;

        // write the key&metadata to the database
        if (!AddKeyPubKey(key, seed))
            throw std::runtime_error(std::string(__func__) + ": AddKeyPubKey failed");
    }

    return seed;
}